

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom(EpsCopyInputStream *this,string_view flat)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  EpsCopyInputStream *this_local;
  string_view flat_local;
  
  flat_local._M_len = (size_t)flat._M_str;
  this_local = (EpsCopyInputStream *)flat._M_len;
  this->overall_limit_ = 0;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar2 < 0x11) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (!bVar1) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      memcpy(this->patch_buffer_,pvVar3,sVar2);
    }
    this->limit_ = 0;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    this->buffer_end_ = this->patch_buffer_ + sVar2;
    this->limit_end_ = this->patch_buffer_ + sVar2;
    this->next_chunk_ = (char *)0x0;
    if (this->aliasing_ == 1) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      this->aliasing_ = (long)pvVar3 - (long)this->patch_buffer_;
    }
    flat_local._M_str = this->patch_buffer_;
  }
  else {
    this->limit_ = 0x10;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    this->buffer_end_ = pvVar3 + (sVar2 - 0x10);
    this->limit_end_ = pvVar3 + (sVar2 - 0x10);
    this->next_chunk_ = this->patch_buffer_;
    if (this->aliasing_ == 1) {
      this->aliasing_ = 2;
    }
    flat_local._M_str =
         std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  return flat_local._M_str;
}

Assistant:

const char* InitFrom(absl::string_view flat) {
    overall_limit_ = 0;
    if (flat.size() > kSlopBytes) {
      limit_ = kSlopBytes;
      limit_end_ = buffer_end_ = flat.data() + flat.size() - kSlopBytes;
      next_chunk_ = patch_buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return flat.data();
    } else {
      if (!flat.empty()) {
        std::memcpy(patch_buffer_, flat.data(), flat.size());
      }
      limit_ = 0;
      limit_end_ = buffer_end_ = patch_buffer_ + flat.size();
      next_chunk_ = nullptr;
      if (aliasing_ == kOnPatch) {
        aliasing_ = reinterpret_cast<std::uintptr_t>(flat.data()) -
                    reinterpret_cast<std::uintptr_t>(patch_buffer_);
      }
      return patch_buffer_;
    }
  }